

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O2

bool __thiscall components::Inference::infer_wumpus(Inference *this,pair<int,_int> room)

{
  bool bVar1;
  pointer ppVar2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> adjacent_rooms;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_30;
  
  get_adjacent_rooms((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48
                     ,(Inference *)room,room);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_30,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48);
  bVar1 = validate_conclusion(this,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    *)&local_30);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_30);
  if (bVar1) {
    bVar1 = KnowledgeBase::get_information_stench
                      (this->current_kb,*local_48._M_impl.super__Vector_impl_data._M_start);
    ppVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
    while (ppVar2 = ppVar2 + 1, ppVar2 != local_48._M_impl.super__Vector_impl_data._M_finish) {
      if (bVar1 == false) {
        bVar1 = false;
      }
      else {
        bVar1 = KnowledgeBase::get_information_stench(this->current_kb,*ppVar2);
      }
    }
  }
  else {
    bVar1 = false;
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_48);
  return bVar1;
}

Assistant:

bool Inference::infer_wumpus(std::pair<int, int> room){
  std::vector<std::pair<int, int>> adjacent_rooms = get_adjacent_rooms(room);
  if(!validate_conclusion(adjacent_rooms)) return false;

  bool conclusion = current_kb.get_information_stench(adjacent_rooms[0]);
  for(auto itr = adjacent_rooms.begin() + 1; itr != adjacent_rooms.end(); itr++){
    conclusion = conclusion && current_kb.get_information_stench(*itr);
  }
  return conclusion;
}